

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O3

bool __thiscall
DIS::ElectromagneticEmissionsPdu::operator==
          (ElectromagneticEmissionsPdu *this,ElectromagneticEmissionsPdu *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  pointer pEVar4;
  ulong uVar5;
  long lVar6;
  
  bVar1 = DistributedEmissionsFamilyPdu::operator==
                    (&this->super_DistributedEmissionsFamilyPdu,
                     &rhs->super_DistributedEmissionsFamilyPdu);
  bVar2 = EntityID::operator==(&this->_emittingEntityID,&rhs->_emittingEntityID);
  bVar3 = EventID::operator==(&this->_eventID,&rhs->_eventID);
  bVar1 = this->_paddingForEmissionsPdu == rhs->_paddingForEmissionsPdu &&
          (this->_stateUpdateIndicator == rhs->_stateUpdateIndicator && (bVar3 && (bVar2 && bVar1)))
  ;
  pEVar4 = (this->_systems).
           super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_systems).
      super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pEVar4) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      bVar2 = ElectromagneticEmissionSystemData::operator==
                        ((ElectromagneticEmissionSystemData *)
                         ((long)&pEVar4->_vptr_ElectromagneticEmissionSystemData + lVar6),
                         (ElectromagneticEmissionSystemData *)
                         ((long)&((rhs->_systems).
                                  super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_ElectromagneticEmissionSystemData + lVar6));
      bVar1 = (bool)(bVar1 & bVar2);
      uVar5 = uVar5 + 1;
      pEVar4 = (this->_systems).
               super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x50;
    } while (uVar5 < (ulong)(((long)(this->_systems).
                                    super__Vector_base<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 4)
                            * -0x3333333333333333));
  }
  return bVar1;
}

Assistant:

bool ElectromagneticEmissionsPdu::operator ==(const ElectromagneticEmissionsPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = DistributedEmissionsFamilyPdu::operator==(rhs);

     if( ! (_emittingEntityID == rhs._emittingEntityID) ) ivarsEqual = false;
     if( ! (_eventID == rhs._eventID) ) ivarsEqual = false;
     if( ! (_stateUpdateIndicator == rhs._stateUpdateIndicator) ) ivarsEqual = false;
     if( ! (_paddingForEmissionsPdu == rhs._paddingForEmissionsPdu) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _systems.size(); idx++)
     {
        if( ! ( _systems[idx] == rhs._systems[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }